

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Windows::TortoiseGitTextDiffReporter::TortoiseGitTextDiffReporter
          (TortoiseGitTextDiffReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Windows::TORTOISE_GIT_TEXT_DIFF();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001a5af8;
  return;
}

Assistant:

TortoiseGitTextDiffReporter::TortoiseGitTextDiffReporter()
            : GenericDiffReporter(DiffPrograms::Windows::TORTOISE_GIT_TEXT_DIFF())
        {
        }